

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O1

bool __thiscall Options::push_expect_var(Options *this,string_view *info)

{
  bool bVar1;
  _Alloc_hider __nptr;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *pcVar12;
  optional<uint32_t> index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  uint local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Options *local_60;
  string_view *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar9 = false;
  local_84 = local_84 & 0xffffff00;
  pcVar12 = info->__data;
  local_60 = this;
  local_58 = info;
  do {
    paVar10 = &local_80.field_2;
    pcVar4 = info->__data + info->__size;
    if (pcVar12 == pcVar4) {
      iVar3 = 2;
      break;
    }
    lVar8 = (long)pcVar4 - (long)pcVar12 >> 2;
    pcVar7 = pcVar12;
    if (0 < lVar8) {
      pcVar7 = pcVar12 + ((long)pcVar4 - (long)pcVar12 & 0xfffffffffffffffc);
      lVar8 = lVar8 + 1;
      pcVar11 = pcVar12 + 3;
      do {
        if ((pcVar11[-3] == ',') || (pcVar11[-3] == ':')) {
          pcVar11 = pcVar11 + -3;
          goto LAB_001a44cf;
        }
        if ((pcVar11[-2] == ',') || (pcVar11[-2] == ':')) {
          pcVar11 = pcVar11 + -2;
          goto LAB_001a44cf;
        }
        if ((pcVar11[-1] == ',') || (pcVar11[-1] == ':')) {
          pcVar11 = pcVar11 + -1;
          goto LAB_001a44cf;
        }
        if ((*pcVar11 == ',') || (*pcVar11 == ':')) goto LAB_001a44cf;
        lVar8 = lVar8 + -1;
        pcVar11 = pcVar11 + 4;
      } while (1 < lVar8);
    }
    lVar8 = (long)pcVar4 - (long)pcVar7;
    if (lVar8 == 1) {
LAB_001a44bc:
      pcVar11 = pcVar7;
      if ((*pcVar7 != ',') && (*pcVar7 != ':')) {
        pcVar11 = pcVar4;
      }
    }
    else if (lVar8 == 2) {
LAB_001a4496:
      pcVar11 = pcVar7;
      if ((*pcVar7 != ',') && (*pcVar7 != ':')) {
        pcVar7 = pcVar7 + 1;
        goto LAB_001a44bc;
      }
    }
    else {
      pcVar11 = pcVar4;
      if (((lVar8 == 3) && (pcVar11 = pcVar7, *pcVar7 != ',')) && (*pcVar7 != ':')) {
        pcVar7 = pcVar7 + 1;
        goto LAB_001a4496;
      }
    }
LAB_001a44cf:
    if (pcVar12 == pcVar11 || pcVar11 == pcVar4) {
      iVar3 = 1;
      bVar1 = false;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar12,pcVar11);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar10) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (*pcVar11 == ':') {
        local_80._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,pcVar11 + 1,info->__data + info->__size);
        __nptr._M_p = local_80._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        *piVar5 = 0;
        lVar8 = strtol(__nptr._M_p,&local_50,10);
        if (local_50 == __nptr._M_p) {
LAB_001a462b:
          uVar6 = std::__throw_invalid_argument("stoi");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Unwind_Resume(uVar6);
        }
        uVar2 = (uint)lVar8;
        if (((int)uVar2 != lVar8) || (*piVar5 == 0x22)) {
          std::__throw_out_of_range("stoi");
          goto LAB_001a462b;
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar3;
        }
        if (!bVar9) {
          bVar9 = true;
        }
        local_84 = uVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        iVar3 = 2;
        bVar1 = false;
        info = local_58;
      }
      else {
        pcVar12 = pcVar11 + 1;
        iVar3 = 0;
        bVar1 = true;
      }
    }
  } while (bVar1);
  if ((iVar3 == 2) && (bVar9)) {
    bVar9 = true;
    std::
    vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
    ::
    emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int&>
              ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
                *)&local_60->expect_vars,&local_48,&local_84);
  }
  else {
    bVar9 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar9;
}

Assistant:

bool Options::push_expect_var(const string_view& info)
{
    std::vector<std::string> names;
    optional<uint32_t> index;

    try
    {
        for(auto it = info.begin(); it != info.end(); )
        {
            auto beg_name = it;
            auto end_name = std::find_if(beg_name, info.end(), [](char c) { return c == ',' || c == ':'; });

            if(end_name == info.end() || beg_name == end_name)
                return false;

            names.emplace_back(std::string(beg_name, end_name));
            if(*end_name == ':')
            {
                index = std::stoi(std::string(end_name+1, info.end()));
                break;
            }

            it = std::next(end_name);
        }
    }
    catch(const std::logic_error&)
    {
        return false;
    }

    if(index)
    {
        this->expect_vars.emplace_back(std::move(names), *index);
        return true;
    }

    return false;
}